

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

bool wasm::Match::
     matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
               (Expression *expr,
               Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
               matcher)

{
  BinaryOp BVar1;
  matched_t<wasm::Const_*> pCVar2;
  bool bVar3;
  BinaryOp BVar4;
  Literal local_38;
  
  bVar3 = false;
  if (expr->_id == BinaryId) {
    if (matcher.binder !=
        (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *
        )0x0) {
      *matcher.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            )expr;
    }
    BVar1 = *(BinaryOp *)(expr + 1);
    BVar4 = Abstract::getBinary((Type)*(uintptr_t *)(expr[1].type.id + 8),matcher.data);
    if (BVar1 == BVar4) {
      if ((matcher.submatchers.curr)->binder !=
          (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        *(matcher.submatchers.curr)->binder =
             (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)expr[1].type.id;
      }
      pCVar2 = *(matched_t<wasm::Const_*> *)(expr + 2);
      bVar3 = false;
      if ((pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
          ConstId) {
        if ((matcher.submatchers.next.curr)->binder != (matched_t<wasm::Const_*> *)0x0) {
          *(matcher.submatchers.next.curr)->binder = pCVar2;
        }
        Literal::Literal(&local_38,&pCVar2->value);
        bVar3 = Internal::
                Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                ::matches(&((matcher.submatchers.next.curr)->submatchers).curr,&local_38);
        Literal::~Literal(&local_38);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

inline bool matches(Expression* expr, Matcher matcher) {
  return matcher.matches(expr);
}